

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes.cc
# Opt level: O2

void __thiscall
cnn::Cube::forward_impl
          (Cube *this,vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_> *xs,
          Tensor *fx)

{
  ArrayWrapper<Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_> local_88
  ;
  NestedExpressionType local_68;
  Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_> local_50;
  CwiseUnaryOp<Eigen::internal::scalar_cube_op<float>,_const_Eigen::ArrayWrapper<const_Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>_>
  local_38;
  
  Tensor::vec(&local_50,
              *(xs->super__Vector_base<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>).
               _M_impl.super__Vector_impl_data._M_start);
  local_38.m_xpr.m_expression._16_1_ = local_50._16_1_;
  local_38.m_xpr.m_expression._0_8_ = local_50._0_8_;
  local_38.m_xpr.m_expression._8_8_ = local_50._8_8_;
  Tensor::vec(&local_68,fx);
  local_88.m_expression._16_1_ = local_68._16_1_;
  local_88.m_expression._0_8_ = local_68._0_8_;
  local_88.m_expression._8_8_ = local_68._8_8_;
  Eigen::internal::
  call_assignment<Eigen::ArrayWrapper<Eigen::Map<Eigen::Matrix<float,_1,1,0,_1,1>,0,Eigen::Stride<0,0>>>,Eigen::CwiseUnaryOp<Eigen::internal::scalar_cube_op<float>,Eigen::ArrayWrapper<Eigen::Map<Eigen::Matrix<float,_1,1,0,_1,1>,0,Eigen::Stride<0,0>>const>const>>
            (&local_88,&local_38);
  return;
}

Assistant:

void Cube::forward_impl(const vector<const Tensor*>& xs, Tensor& fx) const {
#ifdef HAVE_CUDA
  throw std::runtime_error("Square not yet implemented for CUDA");
#else
  fx.vec().array() = xs[0]->vec().array().cube();
#endif
}